

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomAttrPrivate * __thiscall
QDomElementPrivate::setAttributeNode(QDomElementPrivate *this,QDomAttrPrivate *newAttr)

{
  undefined1 *puVar1;
  QDomNamedNodeMapPrivate *pQVar2;
  QDomNodePrivate *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newAttr == (QDomAttrPrivate *)0x0) {
    pQVar3 = (QDomNodePrivate *)0x0;
  }
  else {
    pQVar2 = this->m_attr;
    local_40.d = (newAttr->super_QDomNodePrivate).name.d.d;
    local_40.ptr = (newAttr->super_QDomNodePrivate).name.d.ptr;
    local_40.size = (newAttr->super_QDomNodePrivate).name.d.size;
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar3 = QDomNamedNodeMapPrivate::namedItem(pQVar2,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (pQVar3 != (QDomNodePrivate *)0x0) {
      pQVar2 = this->m_attr;
      local_40.d = (newAttr->super_QDomNodePrivate).name.d.d;
      local_40.ptr = (newAttr->super_QDomNodePrivate).name.d.ptr;
      local_40.size = (newAttr->super_QDomNodePrivate).name.d.size;
      if (local_40.d != (Data *)0x0) {
        LOCK();
        ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QDomNamedNodeMapPrivate::removeNamedItem(pQVar2,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
    QDomNamedNodeMapPrivate::setNamedItem(this->m_attr,&newAttr->super_QDomNodePrivate);
    (newAttr->super_QDomNodePrivate).ownerNode = &this->super_QDomNodePrivate;
    puVar1 = &(newAttr->super_QDomNodePrivate).field_0x98;
    *puVar1 = *puVar1 | 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDomAttrPrivate *)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QDomAttrPrivate* QDomElementPrivate::setAttributeNode(QDomAttrPrivate* newAttr)
{
    if (!newAttr)
        return nullptr;

    QDomNodePrivate* foundAttr = m_attr->namedItem(newAttr->nodeName());
    if (foundAttr)
        m_attr->removeNamedItem(newAttr->nodeName());

    // Referencing is done by the maps
    m_attr->setNamedItem(newAttr);
    newAttr->setParent(this);

    return static_cast<QDomAttrPrivate *>(foundAttr);
}